

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int codeAllEqualityTerms(Parse *pParse,WhereLevel *pLevel,int bRev,int nExtraReg,char **pzAff)

{
  ushort uVar1;
  ushort uVar2;
  Vdbe *p;
  WhereLoop *pWVar3;
  Index *pIdx_00;
  sqlite3 *db;
  WhereTerm *pTerm_00;
  Expr *p_00;
  char cVar4;
  int iVar5;
  int addr;
  int iVar6;
  int iVar7;
  char *pcVar8;
  Expr *pRight;
  int r1;
  int iIdxCur;
  char *zAff;
  int local_58;
  int nReg;
  int regBase;
  int j;
  WhereLoop *pLoop;
  WhereTerm *pTerm;
  Index *pIdx;
  Vdbe *v;
  u16 nSkip;
  u16 nEq;
  char **pzAff_local;
  int nExtraReg_local;
  int bRev_local;
  WhereLevel *pLevel_local;
  Parse *pParse_local;
  
  p = pParse->pVdbe;
  pWVar3 = pLevel->pWLoop;
  uVar1 = (pWVar3->u).btree.nEq;
  uVar2 = pWVar3->nSkip;
  pIdx_00 = (pWVar3->u).btree.pIndex;
  local_58 = pParse->nMem + 1;
  iVar5 = (uint)uVar1 + nExtraReg;
  pParse->nMem = iVar5 + pParse->nMem;
  db = pParse->db;
  pcVar8 = sqlite3IndexAffinityStr(pParse->db,pIdx_00);
  pcVar8 = sqlite3DbStrDup(db,pcVar8);
  if (uVar2 != 0) {
    iVar7 = pLevel->iIdxCur;
    sqlite3VdbeAddOp3(p,0x4b,0,local_58,local_58 + (uint)uVar2 + -1);
    iVar6 = 0x24;
    if (bRev != 0) {
      iVar6 = 0x20;
    }
    sqlite3VdbeAddOp1(p,iVar6,iVar7);
    addr = sqlite3VdbeAddOp0(p,9);
    iVar6 = 0x18;
    if (bRev != 0) {
      iVar6 = 0x15;
    }
    iVar6 = sqlite3VdbeAddOp4Int(p,iVar6,iVar7,0,local_58,(uint)uVar2);
    pLevel->addrSkip = iVar6;
    sqlite3VdbeJumpHere(p,addr);
    for (nReg = 0; nReg < (int)(uint)uVar2; nReg = nReg + 1) {
      sqlite3VdbeAddOp3(p,0x5e,iVar7,nReg,local_58 + nReg);
    }
  }
  for (nReg = (int)uVar2; nReg < (int)(uint)uVar1; nReg = nReg + 1) {
    pTerm_00 = pWVar3->aLTerm[nReg];
    iVar7 = codeEqualityTerm(pParse,pTerm_00,pLevel,nReg,bRev,local_58 + nReg);
    if (iVar7 != local_58 + nReg) {
      if (iVar5 == 1) {
        sqlite3ReleaseTempReg(pParse,local_58);
        local_58 = iVar7;
      }
      else {
        sqlite3VdbeAddOp2(p,0x50,iVar7,local_58 + nReg);
      }
    }
    if ((pTerm_00->eOperator & 1) == 0) {
      if ((pTerm_00->eOperator & 0x100) == 0) {
        p_00 = pTerm_00->pExpr->pRight;
        if (((pTerm_00->wtFlags & 0x800) == 0) && (iVar7 = sqlite3ExprCanBeNull(p_00), iVar7 != 0))
        {
          sqlite3VdbeAddOp2(p,0x32,local_58 + nReg,pLevel->addrBrk);
        }
        if (pParse->nErr == 0) {
          cVar4 = sqlite3CompareAffinity(p_00,pcVar8[nReg]);
          if (cVar4 == 'A') {
            pcVar8[nReg] = 'A';
          }
          iVar7 = sqlite3ExprNeedsNoAffinityChange(p_00,pcVar8[nReg]);
          if (iVar7 != 0) {
            pcVar8[nReg] = 'A';
          }
        }
      }
    }
    else if (((pTerm_00->pExpr->flags & 0x1000) != 0) && (pcVar8 != (char *)0x0)) {
      pcVar8[nReg] = 'A';
    }
  }
  *pzAff = pcVar8;
  return local_58;
}

Assistant:

static int codeAllEqualityTerms(
  Parse *pParse,        /* Parsing context */
  WhereLevel *pLevel,   /* Which nested loop of the FROM we are coding */
  int bRev,             /* Reverse the order of IN operators */
  int nExtraReg,        /* Number of extra registers to allocate */
  char **pzAff          /* OUT: Set to point to affinity string */
){
  u16 nEq;                      /* The number of == or IN constraints to code */
  u16 nSkip;                    /* Number of left-most columns to skip */
  Vdbe *v = pParse->pVdbe;      /* The vm under construction */
  Index *pIdx;                  /* The index being used for this loop */
  WhereTerm *pTerm;             /* A single constraint term */
  WhereLoop *pLoop;             /* The WhereLoop object */
  int j;                        /* Loop counter */
  int regBase;                  /* Base register */
  int nReg;                     /* Number of registers to allocate */
  char *zAff;                   /* Affinity string to return */

  /* This module is only called on query plans that use an index. */
  pLoop = pLevel->pWLoop;
  assert( (pLoop->wsFlags & WHERE_VIRTUALTABLE)==0 );
  nEq = pLoop->u.btree.nEq;
  nSkip = pLoop->nSkip;
  pIdx = pLoop->u.btree.pIndex;
  assert( pIdx!=0 );

  /* Figure out how many memory cells we will need then allocate them.
  */
  regBase = pParse->nMem + 1;
  nReg = nEq + nExtraReg;
  pParse->nMem += nReg;

  zAff = sqlite3DbStrDup(pParse->db,sqlite3IndexAffinityStr(pParse->db,pIdx));
  assert( zAff!=0 || pParse->db->mallocFailed );

  if( nSkip ){
    int iIdxCur = pLevel->iIdxCur;
    sqlite3VdbeAddOp3(v, OP_Null, 0, regBase, regBase+nSkip-1);
    sqlite3VdbeAddOp1(v, (bRev?OP_Last:OP_Rewind), iIdxCur);
    VdbeCoverageIf(v, bRev==0);
    VdbeCoverageIf(v, bRev!=0);
    VdbeComment((v, "begin skip-scan on %s", pIdx->zName));
    j = sqlite3VdbeAddOp0(v, OP_Goto);
    assert( pLevel->addrSkip==0 );
    pLevel->addrSkip = sqlite3VdbeAddOp4Int(v, (bRev?OP_SeekLT:OP_SeekGT),
                            iIdxCur, 0, regBase, nSkip);
    VdbeCoverageIf(v, bRev==0);
    VdbeCoverageIf(v, bRev!=0);
    sqlite3VdbeJumpHere(v, j);
    for(j=0; j<nSkip; j++){
      sqlite3VdbeAddOp3(v, OP_Column, iIdxCur, j, regBase+j);
      testcase( pIdx->aiColumn[j]==XN_EXPR );
      VdbeComment((v, "%s", explainIndexColumnName(pIdx, j)));
    }
  }

  /* Evaluate the equality constraints
  */
  assert( zAff==0 || (int)strlen(zAff)>=nEq );
  for(j=nSkip; j<nEq; j++){
    int r1;
    pTerm = pLoop->aLTerm[j];
    assert( pTerm!=0 );
    /* The following testcase is true for indices with redundant columns.
    ** Ex: CREATE INDEX i1 ON t1(a,b,a); SELECT * FROM t1 WHERE a=0 AND b=0; */
    testcase( (pTerm->wtFlags & TERM_CODED)!=0 );
    testcase( pTerm->wtFlags & TERM_VIRTUAL );
    r1 = codeEqualityTerm(pParse, pTerm, pLevel, j, bRev, regBase+j);
    if( r1!=regBase+j ){
      if( nReg==1 ){
        sqlite3ReleaseTempReg(pParse, regBase);
        regBase = r1;
      }else{
        sqlite3VdbeAddOp2(v, OP_Copy, r1, regBase+j);
      }
    }
    if( pTerm->eOperator & WO_IN ){
      if( pTerm->pExpr->flags & EP_xIsSelect ){
        /* No affinity ever needs to be (or should be) applied to a value
        ** from the RHS of an "? IN (SELECT ...)" expression. The
        ** sqlite3FindInIndex() routine has already ensured that the
        ** affinity of the comparison has been applied to the value.  */
        if( zAff ) zAff[j] = SQLITE_AFF_BLOB;
      }
    }else if( (pTerm->eOperator & WO_ISNULL)==0 ){
      Expr *pRight = pTerm->pExpr->pRight;
      if( (pTerm->wtFlags & TERM_IS)==0 && sqlite3ExprCanBeNull(pRight) ){
        sqlite3VdbeAddOp2(v, OP_IsNull, regBase+j, pLevel->addrBrk);
        VdbeCoverage(v);
      }
      if( pParse->nErr==0 ){
        assert( pParse->db->mallocFailed==0 );
        if( sqlite3CompareAffinity(pRight, zAff[j])==SQLITE_AFF_BLOB ){
          zAff[j] = SQLITE_AFF_BLOB;
        }
        if( sqlite3ExprNeedsNoAffinityChange(pRight, zAff[j]) ){
          zAff[j] = SQLITE_AFF_BLOB;
        }
      }
    }
  }
  *pzAff = zAff;
  return regBase;
}